

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-encoder.c
# Opt level: O2

int mg_session_write_float(mg_session *session,double value)

{
  int iVar1;
  
  iVar1 = mg_session_write_uint8(session,0xc1);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = mg_session_write_uint64(session,(uint64_t)value);
  return iVar1;
}

Assistant:

int mg_session_write_float(mg_session *session, double value) {
  MG_RETURN_IF_FAILED(mg_session_write_uint8(session, MG_MARKER_FLOAT));
  uint64_t as_uint64;
  memcpy(&as_uint64, &value, sizeof(value));
  return mg_session_write_uint64(session, as_uint64);
}